

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

float glu::TextureTestUtil::computeLodFromDerivates
                (LodMode mode,float dudx,float dvdx,float dudy,float dvdy)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  float in_XMM0_Db;
  undefined1 auVar4 [16];
  float in_XMM1_Db;
  float in_XMM2_Db;
  float in_XMM3_Db;
  float fVar5;
  float fVar6;
  
  if (mode - LODMODE_MIN_BOUND < 2) {
    uVar1 = -(uint)(-dudx <= dudx);
    uVar2 = -(uint)(-dudy <= dudy);
    fVar3 = (float)(~uVar1 & (uint)-dudx | (uint)dudx & uVar1);
    fVar6 = (float)(~uVar2 & (uint)-dudy | (uint)dudy & uVar2);
    uVar1 = -(uint)(fVar6 <= fVar3);
    fVar3 = (float)(~uVar1 & (uint)fVar6 | (uint)fVar3 & uVar1);
    uVar1 = -(uint)(-dvdx <= dvdx);
    uVar2 = -(uint)(-dvdy <= dvdy);
    fVar6 = (float)(~uVar1 & (uint)-dvdx | (uint)dvdx & uVar1);
    fVar5 = (float)(~uVar2 & (uint)-dvdy | (uint)dvdy & uVar2);
    uVar1 = -(uint)(fVar5 <= fVar6);
    fVar6 = (float)(~uVar1 & (uint)fVar5 | (uint)fVar6 & uVar1);
    if (mode == LODMODE_MIN_BOUND) {
      fVar3 = (float)(~-(uint)(fVar6 <= fVar3) & (uint)fVar6 | -(uint)(fVar6 <= fVar3) & (uint)fVar3
                     );
    }
    else {
      fVar3 = fVar3 + fVar6;
    }
  }
  else {
    fVar3 = 0.0;
    if (mode == LODMODE_EXACT) {
      auVar4._0_4_ = dudx * dudx + dvdx * dvdx;
      auVar4._4_4_ = dudy * dudy + dvdy * dvdy;
      auVar4._8_4_ = in_XMM0_Db * in_XMM0_Db + in_XMM1_Db * in_XMM1_Db;
      auVar4._12_4_ = in_XMM2_Db * in_XMM2_Db + in_XMM3_Db * in_XMM3_Db;
      auVar4 = sqrtps(auVar4,auVar4);
      uVar1 = -(uint)(auVar4._4_4_ <= auVar4._0_4_);
      fVar3 = (float)(~uVar1 & (uint)auVar4._4_4_ | (uint)auVar4._0_4_ & uVar1);
    }
  }
  fVar3 = deFloatLog2(fVar3);
  return fVar3;
}

Assistant:

float computeLodFromDerivates (LodMode mode, float dudx, float dvdx, float dudy, float dvdy)
{
	float p = 0.0f;
	switch (mode)
	{
		case LODMODE_EXACT:
			p = de::max(deFloatSqrt(dudx*dudx + dvdx*dvdx), deFloatSqrt(dudy*dudy + dvdy*dvdy));
			break;

		case LODMODE_MIN_BOUND:
		case LODMODE_MAX_BOUND:
		{
			float mu = de::max(deFloatAbs(dudx), deFloatAbs(dudy));
			float mv = de::max(deFloatAbs(dvdx), deFloatAbs(dvdy));

			p = mode == LODMODE_MIN_BOUND ? de::max(mu, mv) : mu + mv;
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}

	return deFloatLog2(p);
}